

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O1

uint64_t * refs_iter(refs_table_t *tbl,size_t first,size_t end)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t *puVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  
  if (first != end) {
    puVar1 = tbl->refs_table;
    puVar3 = puVar1;
    puVar4 = puVar1 + first;
    do {
      uVar2 = *puVar4;
      if ((uVar2 == 0x7fffffffffffffff) || (puVar5 = puVar4, uVar2 == 0)) {
        puVar5 = puVar4 + 1;
        puVar4 = puVar3;
      }
      if ((uVar2 != 0x7fffffffffffffff) && (uVar2 != 0)) {
        return puVar4;
      }
      puVar3 = puVar4;
      puVar4 = puVar5;
    } while (puVar5 != puVar1 + end);
  }
  return (uint64_t *)0x0;
}

Assistant:

uint64_t*
refs_iter(refs_table_t *tbl, size_t first, size_t end)
{
    // assert(first < tbl->refs_size);
    // assert(end <= tbl->refs_size);

    _Atomic(uint64_t)* bucket = tbl->refs_table + first;
    while (bucket != tbl->refs_table + end) {
        uint64_t d = atomic_load_explicit(bucket, memory_order_relaxed);
        if (d != 0 && d != refs_ts) return (uint64_t*)bucket;
        bucket++;
    }
    return NULL;
}